

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTest.cxx
# Opt level: O3

string * __thiscall
cmCTest::Base64GzipEncodeFile(string *__return_storage_ptr__,cmCTest *this,string *file)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  bool bVar3;
  int iVar4;
  ostream *poVar5;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *files_00;
  string tarFile;
  string parentDir;
  string currDir;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  files;
  ostringstream cmCTestLog_msg;
  string local_248;
  string local_228;
  string local_208;
  string local_1e8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1c8;
  undefined1 local_1a8 [112];
  ios_base local_138 [264];
  
  cmSystemTools::GetCurrentWorkingDirectory_abi_cxx11_();
  cmsys::SystemTools::GetParentDirectory(&local_208,file);
  if (local_1e8._M_string_length == local_208._M_string_length) {
    if (local_1e8._M_string_length != 0) {
      iVar4 = bcmp(local_1e8._M_dataplus._M_p,local_208._M_dataplus._M_p,local_1e8._M_string_length)
      ;
      if (iVar4 != 0) goto LAB_0018975d;
    }
  }
  else {
LAB_0018975d:
    bVar3 = TryToChangeDirectory(this,&local_208);
    if (!bVar3) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
      goto LAB_001899cd;
    }
  }
  local_248._M_dataplus._M_p = (pointer)&local_248.field_2;
  pcVar2 = (file->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_248,pcVar2,pcVar2 + file->_M_string_length);
  std::__cxx11::string::append((char *)&local_248);
  local_1c8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1c8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1c8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_1c8,file);
  local_1a8._8_8_ = 0;
  local_1a8[0x10] = '\0';
  paVar1 = &local_228.field_2;
  local_228._M_string_length = 0;
  local_228.field_2._M_local_buf[0] = '\0';
  files_00 = &local_1c8;
  local_228._M_dataplus._M_p = (pointer)paVar1;
  local_1a8._0_8_ = local_1a8 + 0x10;
  bVar3 = cmSystemTools::CreateTar
                    (&local_248,files_00,TarCompressGZip,false,(string *)local_1a8,&local_228,0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_228._M_dataplus._M_p != paVar1) {
    files_00 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)(CONCAT71(local_228.field_2._M_allocated_capacity._1_7_,
                            local_228.field_2._M_local_buf[0]) + 1);
    operator_delete(local_228._M_dataplus._M_p,(ulong)files_00);
  }
  if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
    files_00 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)(CONCAT71(local_1a8._17_7_,local_1a8[0x10]) + 1);
    operator_delete((void *)local_1a8._0_8_,(ulong)files_00);
  }
  if (bVar3) {
    Base64EncodeFile(__return_storage_ptr__,(cmCTest *)files_00,&local_248);
    cmsys::SystemTools::RemoveFile(&local_248);
    if (local_1e8._M_string_length == local_208._M_string_length) {
      if (local_1e8._M_string_length != 0) {
        iVar4 = bcmp(local_1e8._M_dataplus._M_p,local_208._M_dataplus._M_p,
                     local_1e8._M_string_length);
        if (iVar4 != 0) goto LAB_0018988f;
      }
    }
    else {
LAB_0018988f:
      cmsys::SystemTools::ChangeDirectory(&local_1e8);
    }
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"Error creating tar while encoding file: ",0x28);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_1a8,(file->_M_dataplus)._M_p,file->_M_string_length);
    std::ios::widen((char)poVar5->_vptr_basic_ostream[-3] + (char)poVar5);
    std::ostream::put((char)poVar5);
    std::ostream::flush();
    std::__cxx11::stringbuf::str();
    Log(this,7,
        "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmCTest.cxx"
        ,0x674,local_228._M_dataplus._M_p,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_228._M_dataplus._M_p != paVar1) {
      operator_delete(local_228._M_dataplus._M_p,
                      CONCAT71(local_228.field_2._M_allocated_capacity._1_7_,
                               local_228.field_2._M_local_buf[0]) + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    std::ios_base::~ios_base(local_138);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_1c8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_248._M_dataplus._M_p != &local_248.field_2) {
    operator_delete(local_248._M_dataplus._M_p,local_248.field_2._M_allocated_capacity + 1);
  }
LAB_001899cd:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_208._M_dataplus._M_p != &local_208.field_2) {
    operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
    operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmCTest::Base64GzipEncodeFile(std::string const& file)
{
  const std::string currDir = cmSystemTools::GetCurrentWorkingDirectory();
  std::string parentDir = cmSystemTools::GetParentDirectory(file);

  // Temporarily change to the file's directory so the tar gets created
  // with a flat directory structure.
  if (currDir != parentDir) {
    if (!this->TryToChangeDirectory(parentDir)) {
      return "";
    }
  }

  std::string tarFile = file + "_temp.tar.gz";
  std::vector<std::string> files;
  files.push_back(file);

  if (!cmSystemTools::CreateTar(tarFile, files, cmSystemTools::TarCompressGZip,
                                false)) {
    cmCTestLog(this, ERROR_MESSAGE,
               "Error creating tar while "
               "encoding file: "
                 << file << std::endl);
    return "";
  }
  std::string base64 = this->Base64EncodeFile(tarFile);
  cmSystemTools::RemoveFile(tarFile);

  // Change back to the directory we started in.
  if (currDir != parentDir) {
    cmSystemTools::ChangeDirectory(currDir);
  }

  return base64;
}